

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# md5lib.c
# Opt level: O1

int decrypt(EVP_PKEY_CTX *ctx,uchar *out,size_t *outlen,uchar *in,size_t inlen)

{
  char cVar1;
  int iVar2;
  char *pcVar3;
  size_t l;
  ulong uVar4;
  ulong uVar5;
  size_t lcyphertext;
  char block [272];
  luaL_Buffer b;
  ulong local_2188;
  long local_2180;
  byte local_2178 [16];
  char local_2168 [280];
  luaL_Buffer local_2050;
  
  pcVar3 = luaL_checklstring((lua_State *)ctx,1,&local_2188);
  cVar1 = *pcVar3;
  uVar5 = (long)cVar1 + 1;
  if ((0x10 < (ulong)(long)cVar1) || (local_2188 < uVar5)) {
    luaL_argerror((lua_State *)ctx,1,"invalid cyphered string");
  }
  local_2188 = local_2188 - uVar5;
  iVar2 = initblock((lua_State *)ctx,pcVar3 + 1,(int)cVar1,local_2168);
  uVar4 = local_2188;
  luaL_buffinit((lua_State *)ctx,&local_2050);
  if (uVar4 != 0) {
    local_2180 = (long)iVar2;
    pcVar3 = pcVar3 + uVar5;
    do {
      md5(local_2168,local_2180,(char *)local_2178);
      uVar4 = uVar4 - 1;
      uVar5 = 0xf;
      if (uVar4 < 0xf) {
        uVar5 = uVar4;
      }
      l = 0;
      do {
        local_2178[l] = local_2178[l] ^ pcVar3[l];
        l = l + 1;
      } while (uVar5 + 1 != l);
      luaL_addlstring(&local_2050,(char *)local_2178,l);
      memcpy(local_2168,pcVar3,l);
      uVar4 = uVar4 - uVar5;
      pcVar3 = pcVar3 + l;
    } while (uVar4 != 0);
  }
  luaL_pushresult(&local_2050);
  return 1;
}

Assistant:

static int decrypt (lua_State *L) {
  size_t lcyphertext;
  const char *cyphertext = luaL_checklstring(L, 1, &lcyphertext);
  size_t lseed = cyphertext[0];
  const char *seed = cyphertext+1;
  int lblock;
  char block[BLOCKSIZE+MAXKEY];
  luaL_argcheck(L, lcyphertext >= lseed+1 && lseed <= BLOCKSIZE, 1,
                 "invalid cyphered string");
  cyphertext += lseed+1;
  lcyphertext -= lseed+1;
  lblock = initblock(L, seed, lseed, block);
  decodestream(L, cyphertext, lcyphertext, block, lblock);
  return 1;
}